

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ostream *poVar4;
  allocator local_31;
  string local_30;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  std::__cxx11::string::string((string *)&local_30,"samples.xml",&local_31);
  read_config_file(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  lVar2 = std::chrono::_V2::system_clock::now();
  uVar3 = (lVar2 - lVar1) / 1000000;
  poVar4 = std::operator<<((ostream *)&std::cout,"All samples done in ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)((lVar2 - lVar1) / 1000000000));
  poVar4 = std::operator<<(poVar4,"s, ");
  poVar4 = (ostream *)
           std::ostream::operator<<
                     (poVar4,(int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 |
                                         uVar3 & 0xffffffff) % 1000));
  std::operator<<(poVar4,"ms.\n");
  return 0;
}

Assistant:

int main() {

  // Initialize rand for non-linux targets
  #ifndef __linux__
    srand(time(nullptr));
  #endif

  std::chrono::time_point<std::chrono::system_clock> start, end;
  start = std::chrono::system_clock::now();

  read_config_file("samples.xml");

  end = std::chrono::system_clock::now();
  int elapsed_s =
      std::chrono::duration_cast<std::chrono::seconds>(end - start).count();
  int elapsed_ms =
      std::chrono::duration_cast<std::chrono::milliseconds>(end - start)
          .count();
  std::cout << "All samples done in " << elapsed_s << "s, " << elapsed_ms % 1000
            << "ms.\n";
}